

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asserter.cpp
# Opt level: O2

void CppUnit::Asserter::failIf(bool shouldFail,string *message,SourceLine *sourceLine)

{
  undefined8 extraout_RAX;
  allocator<char> local_b9;
  string local_b8;
  Message local_98;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"assertion failed",&local_b9);
  Message::Message(&local_98,&local_b8,message);
  if (!shouldFail) {
    Message::~Message(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    return;
  }
  fail(&local_98,sourceLine);
  Message::~Message(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void 
Asserter::failIf( bool shouldFail, 
                  std::string message, 
                  const SourceLine &sourceLine )
{
  failIf( shouldFail, Message( "assertion failed", message ), sourceLine );
}